

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::CuriosityChassis::CuriosityChassis
          (CuriosityChassis *this,string *name,CuriosityChassisType chassis_type,
          shared_ptr<chrono::ChMaterialSurface> *mat)

{
  char *pcVar1;
  shared_ptr<chrono::ChMaterialSurface> local_e0;
  ChQuaternion<double> local_d0;
  ChFrame<double> local_b0;
  
  local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
  local_b0.coord.pos.m_data[0] = VNULL;
  local_b0.coord.pos.m_data[1] = _put;
  local_b0.coord.pos.m_data[2] = _UpdateForces;
  local_b0.coord.rot.m_data[0] = QUNIT;
  local_b0.coord.rot.m_data[1] = _ChLinkMotorRotationSpeed;
  local_b0.coord.rot.m_data[2] = _ChBody;
  local_b0.coord.rot.m_data[3] = _ComputeMassProperties;
  ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,(ChQuaternion<double> *)&QUNIT);
  local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  CuriosityPart::CuriosityPart(&this->super_CuriosityPart,name,&local_b0,&local_e0,false);
  if (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_CuriosityPart)._vptr_CuriosityPart = (_func_int **)&PTR__CuriosityPart_0017e998;
  *(CuriosityChassisType *)&(this->super_CuriosityPart).field_0x234 = chassis_type;
  if (chassis_type == FullRover) {
    (this->super_CuriosityPart).m_mass = 750.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 637.5;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 750.0;
    local_d0.m_data[0] = 1.0;
    local_d0.m_data[1] = 0.0;
    local_d0.m_data[2] = 0.0;
    local_d0.m_data[3] = 0.0;
    local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
    local_b0.coord.pos.m_data[0] = 0.0;
    local_b0.coord.pos.m_data[1] = 0.0;
    local_b0.coord.pos.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[0] = 1.0;
    local_b0.coord.rot.m_data[1] = 0.0;
    local_b0.coord.rot.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,&local_d0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_b0);
    pcVar1 = "curiosity_chassis";
  }
  else {
    if (chassis_type != Scarecrow) goto LAB_001517b2;
    (this->super_CuriosityPart).m_mass = 200.0;
    (this->super_CuriosityPart).m_inertia.m_data[0] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[1] = 80.0;
    (this->super_CuriosityPart).m_inertia.m_data[2] = 100.0;
    local_d0.m_data[0] = 1.0;
    local_d0.m_data[1] = 0.0;
    local_d0.m_data[2] = 0.0;
    local_d0.m_data[3] = 0.0;
    local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0017db90;
    local_b0.coord.pos.m_data[0] = 0.0;
    local_b0.coord.pos.m_data[1] = 0.0;
    local_b0.coord.pos.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[0] = 1.0;
    local_b0.coord.rot.m_data[1] = 0.0;
    local_b0.coord.rot.m_data[2] = 0.0;
    local_b0.coord.rot.m_data[3] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,&local_d0);
    ChFrame<double>::operator=(&(this->super_CuriosityPart).m_cog,&local_b0);
    pcVar1 = "scarecrow_chassis";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_CuriosityPart).m_mesh_name,0,
             (char *)(this->super_CuriosityPart).m_mesh_name._M_string_length,(ulong)pcVar1);
LAB_001517b2:
  (this->super_CuriosityPart).m_color.R = 1.0;
  (this->super_CuriosityPart).m_color.G = 1.0;
  (this->super_CuriosityPart).m_color.B = 1.0;
  return;
}

Assistant:

CuriosityChassis::CuriosityChassis(const std::string& name,
                                   CuriosityChassisType chassis_type,
                                   std::shared_ptr<ChMaterialSurface> mat)
    : CuriosityPart(name, ChFrame<>(VNULL, QUNIT), mat, false), m_chassis_type(chassis_type) {
    switch (m_chassis_type) {
        case CuriosityChassisType::FullRover:
            m_mass = 750;
            m_inertia = ChVector<>(0.85, 0.85, 1.0) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "curiosity_chassis";
            break;

        case CuriosityChassisType::Scarecrow:
            m_mass = 200;
            m_inertia = ChVector<>(0.4, 0.4, 0.5) * m_mass;
            m_cog = ChFrame<>();
            m_mesh_name = "scarecrow_chassis";
            break;
    }
    m_color = ChColor(1.0f, 1.0f, 1.0f);
}